

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_pkg.c
# Opt level: O0

void dill_lookup_xfer_addrs(call_t *t,xfer_entry *x)

{
  int iVar1;
  long *in_RSI;
  long in_RDI;
  xfer_entry *e;
  int i;
  long *local_20;
  int local_14;
  
  for (local_14 = 0; local_20 = in_RSI, local_14 < *(int *)(in_RDI + 4); local_14 = local_14 + 1) {
    for (; *local_20 != 0; local_20 = local_20 + 2) {
      iVar1 = strcmp((char *)*local_20,
                     *(char **)(*(long *)(in_RDI + 8) + (long)local_14 * 0x20 + 0x10));
      if (iVar1 == 0) {
        *(long *)(*(long *)(in_RDI + 8) + (long)local_14 * 0x20 + 8) = local_20[1];
      }
    }
  }
  return;
}

Assistant:

extern void
dill_lookup_xfer_addrs(call_t* t, xfer_entry* x)
{
    int i;
    for (i = 0; i < t->call_count; i++) {
        xfer_entry* e = x;
        while (e->xfer_name != NULL) {
            if (strcmp(e->xfer_name, t->call_locs[i].xfer_name) == 0) {
                t->call_locs[i].xfer_addr = e->xfer_addr;
            }
            e++;
        }
    }
}